

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

void __thiscall QO_Manager::~QO_Manager(QO_Manager *this)

{
  costElem *this_00;
  bool bVar1;
  reference pvVar2;
  pointer ppVar3;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_int,_costElem_*>_> local_20;
  iterator it;
  int i;
  QO_Manager *this_local;
  
  for (it._M_node._4_4_ = 0; it._M_node._4_4_ < this->nRels; it._M_node._4_4_ = it._M_node._4_4_ + 1
      ) {
    std::_Rb_tree_iterator<std::pair<const_int,_costElem_*>_>::_Rb_tree_iterator(&local_20);
    pvVar2 = std::
             vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
             ::operator[](&this->optcost,(long)it._M_node._4_4_);
    local_28 = (_Base_ptr)
               std::
               map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
               ::begin(pvVar2);
    local_20._M_node = local_28;
    while( true ) {
      pvVar2 = std::
               vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
               ::operator[](&this->optcost,(long)it._M_node._4_4_);
      local_30._M_node =
           (_Base_ptr)
           std::
           map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>
           ::end(pvVar2);
      bVar1 = std::operator!=(&local_20,&local_30);
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_costElem_*>_>::operator->(&local_20);
      this_00 = ppVar3->second;
      if (this_00 != (costElem *)0x0) {
        costElem::~costElem(this_00);
        operator_delete(this_00);
      }
      std::_Rb_tree_iterator<std::pair<const_int,_costElem_*>_>::operator++(&local_20);
    }
  }
  std::
  vector<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
  ::~vector(&this->optcost);
  return;
}

Assistant:

QO_Manager::~QO_Manager(){
  for(int i=0; i < nRels; i++){
    map<int, costElem*>::iterator it;
    for(it= optcost[i].begin(); it != optcost[i].end(); ++it){
      delete it->second;
    }
  }
}